

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O2

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationYY<std::complex<double>_>::matrix(RotationYY<std::complex<double>_> *this)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  long lVar4;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<double>_> SVar5;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  uVar2 = *(ulong *)(in_RSI + 0x20);
  (this->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)0x4;
  dense::alloc_unique_array<std::complex<double>>
            ((dense *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable,0x10);
  puVar3 = *(undefined8 **)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *puVar3 = uVar1;
  puVar3[1] = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x10) = 0;
  *(undefined8 *)(lVar4 + 0x18) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x20) = 0;
  *(undefined8 *)(lVar4 + 0x28) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x30) = 0;
  *(ulong *)(lVar4 + 0x38) = uVar2;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x40) = 0;
  *(undefined8 *)(lVar4 + 0x48) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x50) = uVar1;
  *(undefined8 *)(lVar4 + 0x58) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x60) = 0x8000000000000000;
  *(ulong *)(lVar4 + 0x68) = uVar2 ^ 0x8000000000000000;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x70) = 0;
  *(undefined8 *)(lVar4 + 0x78) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x80) = 0;
  *(undefined8 *)(lVar4 + 0x88) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0x90) = 0x8000000000000000;
  *(ulong *)(lVar4 + 0x98) = uVar2 ^ 0x8000000000000000;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0xa0) = uVar1;
  *(undefined8 *)(lVar4 + 0xa8) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0xb0) = 0;
  *(undefined8 *)(lVar4 + 0xb8) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0xc0) = 0;
  *(ulong *)(lVar4 + 200) = uVar2;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0xd0) = 0;
  *(undefined8 *)(lVar4 + 0xd8) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0xe0) = 0;
  *(undefined8 *)(lVar4 + 0xe8) = 0;
  lVar4 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar4 + 0xf0) = uVar1;
  *(undefined8 *)(lVar4 + 0xf8) = 0;
  SVar5.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar5.size_ = (size_type_conflict)this;
  return SVar5;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d ,-o , 0 ,
                                                  0 ,-o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }